

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

int Acb_ObjToGia(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *__assertion;
  long lVar8;
  bool bVar9;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  iVar5 = (p->vObjType).nSize;
  if (iObj < iVar5) {
    if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
      __assert_fail("!Acb_ObjIsCio(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                    ,0x297,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    vTemp->nSize = 0;
    if ((p->vObjFans).nSize <= iObj) goto LAB_0036f67b;
    iVar2 = (p->vObjFans).pArray[(uint)iObj];
    lVar8 = (long)iVar2;
    if ((lVar8 < 0) || ((p->vFanSto).nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar4 = (p->vFanSto).pArray;
    if (0 < piVar4[lVar8]) {
      lVar7 = 0;
      do {
        uVar6 = piVar4[lVar8 + lVar7 + 1];
        if ((long)(int)uVar6 < 1) {
          __assertion = "i>0";
LAB_0036f6c9:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
        }
        uVar3 = (p->vObjCopy).nSize;
        if ((int)uVar3 < 1) {
          __assertion = "Acb_NtkHasObjCopies(p)";
          goto LAB_0036f6c9;
        }
        if (uVar3 <= uVar6) goto LAB_0036f67b;
        iVar5 = (p->vObjCopy).pArray[(int)uVar6];
        if (iVar5 < 0) {
          __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x29b,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
        }
        lVar7 = lVar7 + 1;
        Vec_IntPush(vTemp,iVar5);
      } while (lVar7 < piVar4[lVar8]);
      iVar5 = (p->vObjType).nSize;
    }
    if (iObj < iVar5) {
      bVar1 = (p->vObjType).pArray[(uint)iObj];
      switch(bVar1) {
      case 7:
        uVar6 = 0;
        break;
      case 8:
        uVar6 = 1;
        break;
      default:
        if (bVar1 - 0xd < 2) {
          if (vTemp->nSize < 1) {
            uVar6 = 1;
          }
          else {
            uVar6 = 1;
            lVar8 = 0;
            do {
              uVar6 = Gia_ManHashAnd(pNew,uVar6,vTemp->pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < vTemp->nSize);
            if ((int)uVar6 < 0) goto LAB_0036f629;
          }
          bVar9 = bVar1 == 0xe;
        }
        else if (bVar1 - 0xf < 2) {
          if (vTemp->nSize < 1) {
            uVar6 = 0;
          }
          else {
            lVar8 = 0;
            uVar6 = 0;
            do {
              uVar6 = Gia_ManHashOr(pNew,uVar6,vTemp->pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < vTemp->nSize);
            if ((int)uVar6 < 0) {
LAB_0036f629:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
          }
          bVar9 = bVar1 == 0x10;
        }
        else {
          if (1 < bVar1 - 0x11) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                          ,700,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
          }
          if (vTemp->nSize < 1) {
            uVar6 = 0;
          }
          else {
            lVar8 = 0;
            uVar6 = 0;
            do {
              uVar6 = Gia_ManHashXor(pNew,uVar6,vTemp->pArray[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar8 < vTemp->nSize);
            if ((int)uVar6 < 0) goto LAB_0036f629;
          }
          bVar9 = bVar1 == 0x12;
        }
        uVar6 = bVar9 ^ uVar6;
        break;
      case 0xb:
        if (vTemp->nSize < 1) {
LAB_0036f67b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar6 = *vTemp->pArray;
        break;
      case 0xc:
        if (vTemp->nSize < 1) goto LAB_0036f67b;
        if (*vTemp->pArray < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        uVar6 = *vTemp->pArray ^ 1;
      }
      return uVar6;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Acb_ObjToGia( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF ) 
        return Vec_IntEntry(vTemp, 0);
    if ( Type == ABC_OPER_BIT_INV ) 
        return Abc_LitNot( Vec_IntEntry(vTemp, 0) );
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashAnd( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashOr( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashXor( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}